

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_sl_clip.h
# Opt level: O0

void __thiscall
agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
          (rasterizer_sl_clip<agg::ras_conv_int> *this,rasterizer_cells_aa<agg::cell_aa> *ras,
          coord_type x2,coord_type y2)

{
  uint f1_00;
  uint f2_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int y2_00;
  uint f4;
  uint f3;
  coord_type y4;
  coord_type y3;
  uint f1;
  coord_type y1;
  coord_type x1;
  uint f2;
  coord_type y2_local;
  coord_type x2_local;
  rasterizer_cells_aa<agg::cell_aa> *ras_local;
  rasterizer_sl_clip<agg::ras_conv_int> *this_local;
  
  if ((this->m_clipping & 1U) == 0) {
    iVar3 = ras_conv_int::xi(this->m_x1);
    iVar4 = ras_conv_int::yi(this->m_y1);
    iVar5 = ras_conv_int::xi(x2);
    y2_00 = ras_conv_int::yi(y2);
    rasterizer_cells_aa<agg::cell_aa>::line(ras,iVar3,iVar4,iVar5,y2_00);
  }
  else {
    f2_00 = clipping_flags<int>(x2,y2,&this->m_clip_box);
    if (((this->m_f1 & 10) == (f2_00 & 10)) && ((this->m_f1 & 10) != 0)) {
      this->m_x1 = x2;
      this->m_y1 = y2;
      this->m_f1 = f2_00;
      return;
    }
    iVar3 = this->m_x1;
    iVar4 = this->m_y1;
    f1_00 = this->m_f1;
    switch((f2_00 & 5) + (f1_00 & 5) * 2) {
    case 0:
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,iVar3,iVar4,x2,y2,f1_00,f2_00);
      break;
    case 1:
      iVar5 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x2 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar5 = iVar4 + iVar5;
      uVar1 = clipping_flags_y<int>(iVar5,&this->m_clip_box);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,iVar3,iVar4,(this->m_clip_box).x2,iVar5,f1_00,uVar1);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x2,iVar5,(this->m_clip_box).x2,y2,uVar1,f2_00);
      break;
    case 2:
      iVar3 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x2 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar3 = iVar4 + iVar3;
      uVar1 = clipping_flags_y<int>(iVar3,&this->m_clip_box);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x2,iVar4,(this->m_clip_box).x2,iVar3,f1_00,uVar1);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x2,iVar3,x2,y2,uVar1,f2_00);
      break;
    case 3:
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x2,iVar4,(this->m_clip_box).x2,y2,f1_00,f2_00);
      break;
    case 4:
      iVar5 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x1 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar5 = iVar4 + iVar5;
      uVar1 = clipping_flags_y<int>(iVar5,&this->m_clip_box);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,iVar3,iVar4,(this->m_clip_box).x1,iVar5,f1_00,uVar1);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x1,iVar5,(this->m_clip_box).x1,y2,uVar1,f2_00);
      break;
    case 6:
      iVar5 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x2 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar5 = iVar4 + iVar5;
      iVar3 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x1 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar3 = iVar4 + iVar3;
      uVar1 = clipping_flags_y<int>(iVar5,&this->m_clip_box);
      uVar2 = clipping_flags_y<int>(iVar3,&this->m_clip_box);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x2,iVar4,(this->m_clip_box).x2,iVar5,f1_00,uVar1);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x2,iVar5,(this->m_clip_box).x1,iVar3,uVar1,uVar2);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x1,iVar3,(this->m_clip_box).x1,y2,uVar2,f2_00);
      break;
    case 8:
      iVar3 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x1 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar3 = iVar4 + iVar3;
      uVar1 = clipping_flags_y<int>(iVar3,&this->m_clip_box);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x1,iVar4,(this->m_clip_box).x1,iVar3,f1_00,uVar1);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x1,iVar3,x2,y2,uVar1,f2_00);
      break;
    case 9:
      iVar5 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x1 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar5 = iVar4 + iVar5;
      iVar3 = ras_conv_int::mul_div
                        ((double)((this->m_clip_box).x2 - iVar3),(double)(y2 - iVar4),
                         (double)(x2 - iVar3));
      iVar3 = iVar4 + iVar3;
      uVar1 = clipping_flags_y<int>(iVar5,&this->m_clip_box);
      uVar2 = clipping_flags_y<int>(iVar3,&this->m_clip_box);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x1,iVar4,(this->m_clip_box).x1,iVar5,f1_00,uVar1);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x1,iVar5,(this->m_clip_box).x2,iVar3,uVar1,uVar2);
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x2,iVar3,(this->m_clip_box).x2,y2,uVar2,f2_00);
      break;
    case 0xc:
      line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>
                (this,ras,(this->m_clip_box).x1,iVar4,(this->m_clip_box).x1,y2,f1_00,f2_00);
    }
    this->m_f1 = f2_00;
  }
  this->m_x1 = x2;
  this->m_y1 = y2;
  return;
}

Assistant:

void line_to(Rasterizer& ras, coord_type x2, coord_type y2)
        {
            if(m_clipping)
            {
                unsigned f2 = clipping_flags(x2, y2, m_clip_box);

                if((m_f1 & 10) == (f2 & 10) && (m_f1 & 10) != 0)
                {
                    // Invisible by Y
                    m_x1 = x2;
                    m_y1 = y2;
                    m_f1 = f2;
                    return;
                }

                coord_type x1 = m_x1;
                coord_type y1 = m_y1;
                unsigned   f1 = m_f1;
                coord_type y3, y4;
                unsigned   f3, f4;

                switch(((f1 & 5) << 1) | (f2 & 5))
                {
                case 0: // Visible by X
                    line_clip_y(ras, x1, y1, x2, y2, f1, f2);
                    break;

                case 1: // x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x2, y2, f3, f2);
                    break;

                case 2: // x1 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, x2, y2, f3, f2);
                    break;

                case 3: // x1 > clip.x2 && x2 > clip.x2
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y2, f1, f2);
                    break;

                case 4: // x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x1, y2, f3, f2);
                    break;

                case 6: // x1 > clip.x2 && x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x1, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x1, y4, m_clip_box.x1, y2, f4, f2);
                    break;

                case 8: // x1 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, x2, y2, f3, f2);
                    break;

                case 9:  // x1 < clip.x1 && x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x2, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x2, y4, m_clip_box.x2, y2, f4, f2);
                    break;

                case 12: // x1 < clip.x1 && x2 < clip.x1
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y2, f1, f2);
                    break;
                }
                m_f1 = f2;
            }
            else
            {
                ras.line(Conv::xi(m_x1), Conv::yi(m_y1), 
                         Conv::xi(x2),   Conv::yi(y2)); 
            }
            m_x1 = x2;
            m_y1 = y2;
        }